

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O1

ares_dns_rr_t * has_opt(ares_dns_record_t *dnsrec,ares_dns_section_t section)

{
  int iVar1;
  long lVar2;
  ares_dns_rr_t *paVar3;
  ulong uVar4;
  ulong uVar5;
  
  lVar2 = ares_dns_record_rr_cnt();
  if (lVar2 != 0) {
    uVar5 = 0;
    do {
      paVar3 = (ares_dns_rr_t *)ares_dns_record_rr_get_const(dnsrec,section,uVar5);
      iVar1 = ares_dns_rr_get_type(paVar3);
      if (iVar1 == 0x29) {
        return paVar3;
      }
      uVar5 = uVar5 + 1;
      uVar4 = ares_dns_record_rr_cnt(dnsrec,section);
    } while (uVar5 < uVar4);
  }
  return (ares_dns_rr_t *)0x0;
}

Assistant:

static const ares_dns_rr_t *has_opt(const ares_dns_record_t *dnsrec,
                                    ares_dns_section_t       section)
{
  size_t i;
  for (i = 0; i < ares_dns_record_rr_cnt(dnsrec, section); i++) {
    const ares_dns_rr_t *rr = ares_dns_record_rr_get_const(dnsrec, section, i);
    if (ares_dns_rr_get_type(rr) == ARES_REC_TYPE_OPT) {
      return rr;
    }
  }
  return NULL;
}